

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_create.cpp
# Opt level: O3

BoundStatement * __thiscall
duckdb::Binder::Bind(BoundStatement *__return_storage_ptr__,Binder *this,CreateStatement *stmt)

{
  unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *this_00;
  pointer *ppCVar1;
  byte bVar2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  SchemaCatalogEntry *schema;
  ClientContext *pCVar4;
  TableCatalogEntry *pTVar5;
  long *plVar6;
  pointer pVVar7;
  size_type sVar8;
  pointer pcVar9;
  vector<duckdb::DummyBinding,_true> *pvVar10;
  ColumnBinding binding;
  CatalogTransaction transaction_00;
  optional_ptr<duckdb::ExpressionBinder,_true> oVar11;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  bool bVar13;
  int iVar14;
  pointer pCVar15;
  StatementProperties *this_01;
  pointer pBVar16;
  undefined8 uVar17;
  pointer pLVar18;
  Catalog *pCVar19;
  pointer pEVar20;
  type pEVar21;
  __uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_> this_02;
  pointer pBVar22;
  BoundBaseTableRef *pBVar23;
  type statement;
  reference pvVar24;
  pointer pLVar25;
  reference pvVar26;
  BoundColumnRefExpression *this_03;
  idx_t table_index;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  pointer this_04;
  CreateViewInfo *base;
  type pCVar28;
  optional_ptr<duckdb::SchemaCatalogEntry,_true> oVar29;
  _Head_base<0UL,_duckdb::LogicalCreateTable_*,_false> _Var30;
  string *psVar31;
  vector<duckdb::Value,_true> *pvVar32;
  SecretManager *this_05;
  InvalidInputException *pIVar33;
  InternalException *this_06;
  BinderException *pBVar34;
  Value *item;
  BoundStatement *pBVar35;
  pointer pVVar36;
  _Head_base<0UL,_duckdb::LogicalCreateTable_*,_false> _Var37;
  pointer pBVar38;
  size_type *this_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<duckdb::LogicalType> __l_00;
  __alloc_node_gen_t __alloc_node_gen;
  case_insensitive_map_t<Value> bound_options;
  CreateSecretInput create_secret_input;
  CatalogTransaction transaction;
  ConstantBinder default_binder;
  string provider_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  scope_strings;
  string type_string;
  undefined1 local_370 [8];
  undefined1 local_368 [64];
  optional_ptr<duckdb::ExpressionBinder,_true> local_328;
  optional_idx local_320;
  _Head_base<0UL,_duckdb::LogicalCreateTable_*,_false> local_318;
  _Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false> _Stack_310;
  element_type *local_308;
  ClientContext *pCStack_300;
  __uniq_ptr_impl<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  local_2f8;
  element_type *peStack_2f0;
  ClientContext *local_2e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  float local_2c0;
  undefined4 uStack_2bc;
  size_t sStack_2b8;
  undefined1 auStack_2b0 [8];
  undefined1 local_2a8 [8];
  element_type *peStack_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  Val local_288;
  undefined1 local_278 [16];
  Val local_268;
  char local_258 [16];
  _Alloc_hider local_248;
  vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_> local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_228 [24];
  __buckets_ptr local_210;
  size_type local_208;
  __node_base local_200;
  size_type local_1f8;
  _Prime_rehash_policy local_1f0;
  __node_base_ptr local_1e0;
  OnCreateConflict local_1d8;
  SecretPersistType local_1d7;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1c8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_1c0;
  CreateInfo *local_1b8;
  DatabaseInstance *local_1b0;
  BoundStatement *local_1a8;
  undefined1 local_1a0 [40];
  undefined1 local_178 [104];
  _Alloc_hider local_110;
  char local_100 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  __node_base local_e0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  __node_base local_b0;
  pointer local_a8;
  _Hash_node_base local_a0 [2];
  string local_90;
  _Any_data local_70;
  __node_base local_60;
  code *local_58;
  _Any_data local_50;
  __node_base_ptr local_40;
  code *local_38;
  
  local_2f8._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
       (_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
        )0x0;
  peStack_2f0 = (element_type *)0x0;
  local_308 = (element_type *)0x0;
  pCStack_300 = (ClientContext *)0x0;
  local_318._M_head_impl = (LogicalCreateTable *)0x0;
  _Stack_310._M_head_impl = (BoundCreateTableInfo *)0x0;
  local_2e8 = (ClientContext *)0x0;
  local_2a8 = (undefined1  [8])&local_298;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Count","");
  __l._M_len = 1;
  __l._M_array = (iterator)local_2a8;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_368,__l,(allocator_type *)local_2e0._M_local_buf);
  local_178._16_8_ = local_2e8;
  local_178._8_8_ = peStack_2f0;
  local_178._0_8_ =
       local_2f8._M_t.
       super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
       .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl;
  local_2e8 = (ClientContext *)local_368._16_8_;
  local_2f8._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
       (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
       local_368._0_8_;
  peStack_2f0 = (element_type *)local_368._8_8_;
  local_368._0_8_ =
       (__uniq_ptr_data<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true,_true>
        )0x0;
  local_368._8_8_ = (element_type *)0x0;
  local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_178);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_368);
  if (local_2a8 != (undefined1  [8])&local_298) {
    operator_delete((void *)local_2a8);
  }
  LogicalType::LogicalType((LogicalType *)local_368,BIGINT);
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_368;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_178,__l_00,
             (allocator_type *)local_2e0._M_local_buf);
  local_298._M_allocated_capacity = (size_type)pCStack_300;
  peStack_2a0 = local_308;
  local_2a8 = (undefined1  [8])_Stack_310;
  pCStack_300 = (ClientContext *)local_178._16_8_;
  _Stack_310._M_head_impl = (BoundCreateTableInfo *)local_178._0_8_;
  local_308 = (element_type *)local_178._8_8_;
  local_178._0_8_ =
       (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
       0x0;
  local_178._8_8_ = (element_type *)0x0;
  local_178._16_8_ = (ClientContext *)0x0;
  local_1a8 = __return_storage_ptr__;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_2a8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)local_178);
  LogicalType::~LogicalType((LogicalType *)local_368);
  this_00 = &stmt->info;
  pCVar15 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
            operator->(this_00);
  bVar2 = (pCVar15->super_ParseInfo).field_0x9;
  this_01 = GetStatementProperties(this);
  if (0x1d < bVar2) {
    if (bVar2 == 0x1e) {
      pCVar28 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator*(this_00);
      oVar29.ptr = BindCreateFunctionInfo(this,pCVar28);
      _Var30._M_head_impl = (LogicalCreateTable *)operator_new(0x78);
      local_2a8 = (undefined1  [8])
                  (this_00->
                  super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
                  _M_t.
                  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                  .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
      .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
      LogicalCreate::LogicalCreate
                ((LogicalCreate *)_Var30._M_head_impl,LOGICAL_CREATE_MACRO,
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 local_2a8,oVar29);
    }
    else {
      if (bVar2 != 0x1f) {
        if (bVar2 != 0x47) goto switchD_011bcc47_caseD_5;
        pCVar19 = Catalog::GetSystemCatalog(this->context);
        CatalogTransaction::CatalogTransaction
                  ((CatalogTransaction *)local_1a0,pCVar19,this->context);
        this_01->return_type = QUERY_RESULT;
        local_328.ptr =
             (ExpressionBinder *)
             unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
             operator->(this_00);
        pCVar4 = this->context;
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"Secret Parameter","")
        ;
        ConstantBinder::ConstantBinder((ConstantBinder *)local_178,this,pCVar4,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p);
        }
        local_e8._M_pi = &local_d8;
        local_e0._M_nxt = (_Hash_node_base *)0x0;
        local_d8._vptr__Sp_counted_base._0_1_ = 0;
        local_b0._M_nxt = local_a0;
        local_a8 = (pointer)0x0;
        local_a0[0]._M_nxt._0_1_ = 0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        if ((((string *)&local_328.ptr[3].macro_binding)->_M_dataplus)._M_p != (pointer)0x0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_370,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_178,(LogicalType *)&local_328.ptr[3].macro_binding,false);
          pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_370);
          iVar14 = (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[6])(pEVar20);
          if ((char)iVar14 != '\0') {
            pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_2a8 = (undefined1  [8])&local_298;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Create Secret expressions can not have parameters!","");
            InvalidInputException::InvalidInputException(pIVar33,(string *)local_2a8);
            __cxa_throw(pIVar33,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar4 = this->context;
          pEVar21 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_370);
          ExpressionExecutor::EvaluateScalar((Value *)local_2a8,pCVar4,pEVar21,true);
          Value::ToString_abi_cxx11_((string *)&local_2e0,(Value *)local_2a8);
          StringUtil::Lower((string *)local_368,(string *)&local_2e0);
          ::std::__cxx11::string::operator=((string *)&local_e8,(string *)local_368);
          if ((LogicalOperator *)local_368._0_8_ != (LogicalOperator *)(local_368 + 0x10)) {
            operator_delete((void *)local_368._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_allocated_capacity != &local_2d0) {
            operator_delete((void *)local_2e0._M_allocated_capacity);
          }
          Value::~Value((Value *)local_2a8);
          if (local_370 != (undefined1  [8])0x0) {
            (*((BaseExpression *)local_370)->_vptr_BaseExpression[1])();
          }
        }
        if (local_328.ptr[2].bound_columns.
            super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
            .
            super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_370,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_178,
                     (optional_ptr<duckdb::LogicalType,_true>)
                     &local_328.ptr[2].bound_columns.
                      super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                      .
                      super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
          pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_370);
          iVar14 = (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[6])(pEVar20);
          if ((char)iVar14 != '\0') {
            pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_2a8 = (undefined1  [8])&local_298;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Create Secret expressions can not have parameters!","");
            InvalidInputException::InvalidInputException(pIVar33,(string *)local_2a8);
            __cxa_throw(pIVar33,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar4 = this->context;
          pEVar21 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_370);
          ExpressionExecutor::EvaluateScalar((Value *)local_2a8,pCVar4,pEVar21,true);
          Value::ToString_abi_cxx11_((string *)&local_2e0,(Value *)local_2a8);
          StringUtil::Lower((string *)local_368,(string *)&local_2e0);
          ::std::__cxx11::string::operator=((string *)&local_b0,(string *)local_368);
          if ((BaseTableRef *)local_368._0_8_ != (BaseTableRef *)(local_368 + 0x10)) {
            operator_delete((void *)local_368._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_allocated_capacity != &local_2d0) {
            operator_delete((void *)local_2e0._M_allocated_capacity);
          }
          Value::~Value((Value *)local_2a8);
          if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
              local_370 != (Expression *)0x0) {
            (**(code **)(*(_func_int **)local_370 + 8))();
          }
        }
        if ((((string *)&local_328.ptr[3].stored_binder)->_M_dataplus)._M_p != (pointer)0x0) {
          ExpressionBinder::Bind
                    ((ExpressionBinder *)local_370,
                     (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                      *)local_178,(LogicalType *)&local_328.ptr[3].stored_binder,false);
          pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                *)local_370);
          iVar14 = (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[6])(pEVar20);
          if ((char)iVar14 != '\0') {
            pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_2a8 = (undefined1  [8])&local_298;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2a8,"Create Secret expressions can not have parameters!","");
            InvalidInputException::InvalidInputException(pIVar33,(string *)local_2a8);
            __cxa_throw(pIVar33,&InvalidInputException::typeinfo,
                        ::std::runtime_error::~runtime_error);
          }
          pCVar4 = this->context;
          pEVar21 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                    operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                               *)local_370);
          ExpressionExecutor::EvaluateScalar((Value *)local_2a8,pCVar4,pEVar21,true);
          LogicalType::LogicalType((LogicalType *)local_368,VARCHAR);
          bVar13 = LogicalType::operator==((LogicalType *)local_2a8,(LogicalType *)local_368);
          LogicalType::~LogicalType((LogicalType *)local_368);
          if (bVar13) {
            Value::ToString_abi_cxx11_((string *)local_368,(Value *)local_2a8);
            ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_368);
            if ((BaseTableRef *)local_368._0_8_ != (BaseTableRef *)(local_368 + 0x10)) {
              operator_delete((void *)local_368._0_8_);
            }
          }
          else {
            LogicalType::LogicalType((LogicalType *)&local_2e0,VARCHAR);
            LogicalType::LIST((LogicalType *)local_368,(LogicalType *)&local_2e0);
            bVar13 = LogicalType::operator==((LogicalType *)local_2a8,(LogicalType *)local_368);
            LogicalType::~LogicalType((LogicalType *)local_368);
            LogicalType::~LogicalType((LogicalType *)&local_2e0);
            if (bVar13) {
              pvVar32 = ListValue::GetChildren((Value *)local_2a8);
              pVVar36 = (pvVar32->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pVVar7 = (pvVar32->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (pVVar36 != pVVar7) {
                do {
                  Value::GetValue<std::__cxx11::string>((string *)local_368,pVVar36);
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_c8,(string *)local_368);
                  if ((LogicalOperator *)local_368._0_8_ != (LogicalOperator *)(local_368 + 0x10)) {
                    operator_delete((void *)local_368._0_8_);
                  }
                  pVVar36 = pVVar36 + 1;
                } while (pVVar36 != pVVar7);
              }
            }
            else {
              if (local_2a8[1] != STRUCT) {
                pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                local_368._0_8_ = (long)local_368 + 0x10;
                ::std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_368,
                           "Create Secret scope must be of type VARCHAR or LIST(VARCHAR)","");
                InvalidInputException::InvalidInputException(pIVar33,(string *)local_368);
                __cxa_throw(pIVar33,&InvalidInputException::typeinfo,
                            ::std::runtime_error::~runtime_error);
              }
              pvVar32 = StructValue::GetChildren((Value *)local_2a8);
              pVVar36 = (pvVar32->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pVVar7 = (pvVar32->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                       super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (pVVar36 != pVVar7) {
                do {
                  LogicalType::LogicalType((LogicalType *)local_368,VARCHAR);
                  bVar13 = LogicalType::operator==(&pVVar36->type_,(LogicalType *)local_368);
                  LogicalType::~LogicalType((LogicalType *)local_368);
                  if (!bVar13) {
                    pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
                    local_368._0_8_ = (LogicalOperator *)(local_368 + 0x10);
                    ::std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_368,
                               "Invalid input to scope parameter of create secret: only struct of VARCHARs is allowed"
                               ,"");
                    InvalidInputException::InvalidInputException(pIVar33,(string *)local_368);
                    __cxa_throw(pIVar33,&InvalidInputException::typeinfo,
                                ::std::runtime_error::~runtime_error);
                  }
                  Value::GetValue<std::__cxx11::string>((string *)local_368,pVVar36);
                  ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<std::__cxx11::string>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             &local_c8,(string *)local_368);
                  if ((LogicalOperator *)local_368._0_8_ != (LogicalOperator *)(local_368 + 0x10)) {
                    operator_delete((void *)local_368._0_8_);
                  }
                  pVVar36 = pVVar36 + 1;
                } while (pVVar36 != pVVar7);
              }
            }
          }
          Value::~Value((Value *)local_2a8);
          if (local_370 != (undefined1  [8])0x0) {
            (*((BaseExpression *)local_370)->_vptr_BaseExpression[1])();
          }
        }
        local_2e0._M_allocated_capacity = (size_type)auStack_2b0;
        local_2e0._8_8_ = 1;
        local_2d0._M_allocated_capacity = 0;
        local_2d0._8_8_ = 0;
        local_2c0 = 1.0;
        sStack_2b8 = 0;
        auStack_2b0 = (undefined1  [8])0x0;
        pBVar38 = local_328.ptr[3].bound_columns.
                  super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                  .
                  super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        if (pBVar38 != (pointer)0x0) {
          do {
            ExpressionBinder::Bind
                      ((ExpressionBinder *)local_370,
                       (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                        *)local_178,(LogicalType *)(pBVar38 + 1),false);
            pEVar20 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator->((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                    *)local_370);
            iVar14 = (*(pEVar20->super_BaseExpression)._vptr_BaseExpression[6])(pEVar20);
            if ((char)iVar14 != '\0') {
              pIVar33 = (InvalidInputException *)__cxa_allocate_exception(0x10);
              local_2a8 = (undefined1  [8])&local_298;
              ::std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_2a8,"Create Secret expressions can not have parameters!",""
                        );
              InvalidInputException::InvalidInputException(pIVar33,(string *)local_2a8);
              __cxa_throw(pIVar33,&InvalidInputException::typeinfo,
                          ::std::runtime_error::~runtime_error);
            }
            pCVar4 = this->context;
            pEVar21 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                      ::operator*((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                                   *)local_370);
            ExpressionExecutor::EvaluateScalar((Value *)local_368,pCVar4,pEVar21,true);
            local_2a8 = (undefined1  [8])&local_298;
            sVar8 = (pBVar38->name)._M_string_length;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)local_2a8,sVar8,
                       (pBVar38->name).field_2._M_allocated_capacity + sVar8);
            Value::Value((Value *)&local_288.hugeint,(Value *)local_368);
            ::std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string_const,duckdb::Value>>
                      (&local_2e0,
                       (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)local_2a8);
            Value::~Value((Value *)&local_288.hugeint);
            if (local_2a8 != (undefined1  [8])&local_298) {
              operator_delete((void *)local_2a8);
            }
            Value::~Value((Value *)local_368);
            if (local_370 != (undefined1  [8])0x0) {
              (*((BaseExpression *)local_370)->_vptr_BaseExpression[1])();
            }
            pBVar38 = (pointer)(pBVar38->name)._M_dataplus._M_p;
          } while (pBVar38 != (pointer)0x0);
        }
        local_2a8 = (undefined1  [8])&local_298;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_2a8,local_b0._M_nxt,
                   (long)&(local_a8->
                          super_unique_ptr<duckdb::Binding,_std::default_delete<duckdb::Binding>_>).
                          _M_t.
                          super___uniq_ptr_impl<duckdb::Binding,_std::default_delete<duckdb::Binding>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_duckdb::Binding_*,_std::default_delete<duckdb::Binding>_>
                          .super__Head_base<0UL,_duckdb::Binding_*,_false>._M_head_impl +
                   (long)local_b0._M_nxt);
        local_288.bigint = (int64_t)local_278;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_288,local_e8._M_pi,
                   (long)&(local_e0._M_nxt)->_M_nxt + (long)local_e8._M_pi);
        oVar11.ptr = local_328.ptr;
        pcVar9 = ((_Alloc_hider *)&local_328.ptr[3]._vptr_ExpressionBinder)->_M_p;
        local_268.bigint = (int64_t)local_258;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_268,pcVar9,pcVar9 + *(size_type *)&local_328.ptr[3].target_type)
        ;
        ppCVar1 = &local_240.
                   super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        pvVar10 = oVar11.ptr[3].lambda_bindings.ptr;
        local_248._M_p = (pointer)ppCVar1;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_248,pvVar10,
                   (long)&(pvVar10->
                          super_vector<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>)
                          .
                          super__Vector_base<duckdb::DummyBinding,_std::allocator<duckdb::DummyBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start +
                   ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&oVar11.ptr[3].stack_depth)->_M_allocated_capacity);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(local_228,&local_c8);
        local_210 = (__buckets_ptr)0x0;
        local_208 = local_2e0._8_8_;
        local_200._M_nxt = (_Hash_node_base *)0x0;
        local_1f8 = local_2d0._8_8_;
        local_1f0._4_4_ = uStack_2bc;
        local_1f0._M_max_load_factor = local_2c0;
        local_1f0._M_next_resize = sStack_2b8;
        local_1e0 = (__node_base_ptr)0x0;
        local_368._0_8_ = &local_210;
        ::std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::
        _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,duckdb::Value>,true>>>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::Value>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::Value>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&local_210,
                   (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&local_2e0,
                   (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_true>_>_>
                    *)local_368);
        local_1d8 = *(OnCreateConflict *)
                     &local_328.ptr[2].bound_columns.
                      super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                      .
                      super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
        local_1d7 = *(SecretPersistType *)
                     ((long)&local_328.ptr[2].bound_columns.
                             super_vector<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                             .
                             super__Vector_base<duckdb::BoundColumnReferenceInfo,_std::allocator<duckdb::BoundColumnReferenceInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1);
        this_05 = SecretManager::Get(this->context);
        transaction_00.context.ptr = (ClientContext *)local_1a0._8_8_;
        transaction_00.db.ptr = (DatabaseInstance *)local_1a0._0_8_;
        transaction_00.transaction.ptr = (Transaction *)local_1a0._16_8_;
        transaction_00.transaction_id = local_1a0._24_8_;
        transaction_00.start_time = local_1a0._32_8_;
        SecretManager::BindCreateSecret
                  (local_1a8,this_05,transaction_00,(CreateSecretInput *)local_2a8);
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_210);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_228);
        if ((pointer *)local_248._M_p != ppCVar1) {
          operator_delete(local_248._M_p);
        }
        pBVar35 = local_1a8;
        if (local_268._0_8_ != local_258) {
          operator_delete((void *)local_268.bigint);
        }
        if (local_288._0_8_ != local_278) {
          operator_delete((void *)local_288.bigint);
        }
        if (local_2a8 != (undefined1  [8])&local_298) {
          operator_delete((void *)local_2a8);
        }
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::Value>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                       *)&local_2e0);
        ::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_c8);
        if (local_b0._M_nxt != local_a0) {
          operator_delete(local_b0._M_nxt);
        }
        if (local_e8._M_pi != &local_d8) {
          operator_delete(local_e8._M_pi);
        }
        local_178._0_8_ = &PTR__ConstantBinder_0244c980;
        if (local_110._M_p != local_100) {
          operator_delete(local_110._M_p);
        }
        ExpressionBinder::~ExpressionBinder((ExpressionBinder *)local_178);
        goto LAB_011bda5f;
      }
      pCVar28 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator*(this_00);
      oVar29.ptr = BindCreateSchema(this,pCVar28);
      _Var30._M_head_impl = (LogicalCreateTable *)operator_new(0x78);
      local_2a8 = (undefined1  [8])
                  (this_00->
                  super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
                  _M_t.
                  super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                  .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
      (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
      .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
      super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
      LogicalCreate::LogicalCreate
                ((LogicalCreate *)_Var30._M_head_impl,LOGICAL_CREATE_MACRO,
                 (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
                 local_2a8,oVar29);
    }
    goto LAB_011bd9b5;
  }
  switch(bVar2) {
  case 1:
    local_1b8 = (this_00->
                super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
                .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    BindCreateTableInfo((Binder *)local_178,
                        (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>
                         *)this);
    if (local_1b8 != (CreateInfo *)0x0) {
      (**(code **)((long)(local_1b8->super_ParseInfo)._vptr_ParseInfo + 8))();
    }
    local_1b8 = (CreateInfo *)0x0;
    pBVar16 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                            *)local_178);
    _Var3._M_head_impl =
         (pBVar16->query).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    (pBVar16->query).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
    local_368._0_8_ = _Var3._M_head_impl;
    pBVar16 = unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
              ::operator->((unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                            *)local_178);
    schema = pBVar16->schema;
    uVar17 = operator_new(0x78);
    local_2a8 = (undefined1  [8])local_178._0_8_;
    local_178._0_8_ = (_Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>)0x0;
    LogicalCreateTable::LogicalCreateTable
              ((LogicalCreateTable *)uVar17,schema,
               (unique_ptr<duckdb::BoundCreateTableInfo,_std::default_delete<duckdb::BoundCreateTableInfo>,_true>
                *)local_2a8);
    local_2e0._M_allocated_capacity = uVar17;
    if (local_2a8 != (undefined1  [8])0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_2a8,
                 (BoundCreateTableInfo *)local_2a8);
    }
    if (_Var3._M_head_impl != (LogicalOperator *)0x0) {
      this_01->return_type = CHANGED_ROWS;
      pLVar18 = unique_ptr<duckdb::LogicalCreateTable,_std::default_delete<duckdb::LogicalCreateTable>,_true>
                ::operator->((unique_ptr<duckdb::LogicalCreateTable,_std::default_delete<duckdb::LogicalCreateTable>,_true>
                              *)&local_2e0._M_allocated_capacity);
      ::std::
      vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((vector<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>>
                  *)&(pLVar18->super_LogicalOperator).children,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)local_368);
      uVar17 = local_2e0._M_allocated_capacity;
    }
    local_2e0._M_allocated_capacity = 0;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_318._M_head_impl !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) &&
       (paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_318._M_head_impl)->super_LogicalOperator,
       local_318._M_head_impl = (LogicalCreateTable *)uVar17,
       (**(code **)(paVar27->_M_allocated_capacity + 8))(), uVar17 = local_318._M_head_impl,
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)local_2e0._M_allocated_capacity !=
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x0)) {
      (**(code **)(*local_2e0._M_allocated_capacity + 8))();
      uVar17 = local_318._M_head_impl;
    }
    local_318._M_head_impl = (LogicalCreateTable *)uVar17;
    if ((LogicalOperator *)local_368._0_8_ != (LogicalOperator *)0x0) {
      (**(code **)(*(long *)local_368._0_8_ + 8))();
    }
    if ((BoundCreateTableInfo *)local_178._0_8_ != (BoundCreateTableInfo *)0x0) {
      ::std::default_delete<duckdb::BoundCreateTableInfo>::operator()
                ((default_delete<duckdb::BoundCreateTableInfo> *)local_178,
                 (BoundCreateTableInfo *)local_178._0_8_);
    }
    goto LAB_011bd9e3;
  case 2:
    pCVar15 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(this_00);
    BindCatalog((string *)local_2a8,this,&pCVar15->catalog);
    pCVar19 = Catalog::GetCatalog(this->context,(string *)local_2a8);
    StatementProperties::RegisterDBModify(this_01,pCVar19,this->context);
    _Var30._M_head_impl = (LogicalCreateTable *)operator_new(0x78);
    local_178._0_8_ =
         (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>).
         _M_t.super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>.
         _M_t.super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
         .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    LogicalCreate::LogicalCreate
              ((LogicalCreate *)_Var30._M_head_impl,LOGICAL_CREATE_SCHEMA,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               local_178,(optional_ptr<duckdb::SchemaCatalogEntry,_true>)0x0);
    if ((tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
        local_178._0_8_ != (_Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>)0x0) {
      (*((_func_int **)
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_178._0_8_)->_M_allocated_capacity)[1])();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(local_318._M_head_impl)->super_LogicalOperator;
      local_318._M_head_impl = _Var30._M_head_impl;
      (**(code **)(paVar27->_M_allocated_capacity + 8))();
      _Var30._M_head_impl = local_318._M_head_impl;
    }
    break;
  case 3:
    base = (CreateViewInfo *)
           unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::operator->
                     (this_00);
    pCVar28 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator*(this_00);
    oVar29.ptr = BindCreateSchema(this,pCVar28);
    BindCreateViewInfo(this,base);
    _Var30._M_head_impl = (LogicalCreateTable *)operator_new(0x78);
    local_2a8 = (undefined1  [8])
                (this_00->
                super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
                .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    LogicalCreate::LogicalCreate
              ((LogicalCreate *)_Var30._M_head_impl,LOGICAL_CREATE_VIEW,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               local_2a8,oVar29);
    goto LAB_011bd9b5;
  case 4:
    pCVar15 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(this_00);
    TableDescription::TableDescription
              ((TableDescription *)local_2a8,&pCVar15->catalog,&pCVar15->schema,
               (string *)(pCVar15 + 1));
    this_02._M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)
         operator_new(0xd0);
    BaseTableRef::BaseTableRef
              ((BaseTableRef *)
               this_02._M_t.
               super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
               .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl,
               (TableDescription *)local_2a8);
    local_368._0_8_ =
         this_02._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BaseTableRef,_std::default_delete<duckdb::BaseTableRef>,_true> *)
               local_368);
    Bind((Binder *)&local_2e0,(BaseTableRef *)this);
    pBVar22 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
              operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                          *)&local_2e0._M_allocated_capacity);
    if (pBVar22->type != BASE_TABLE) {
      pBVar34 = (BinderException *)__cxa_allocate_exception(0x10);
      local_178._0_8_ = (long)local_178 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"can only create an index on a base table","");
      BinderException::BinderException(pBVar34,(string *)local_178);
      __cxa_throw(pBVar34,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pBVar22 = unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::
              operator->((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                          *)&local_2e0._M_allocated_capacity);
    pBVar23 = BoundTableRef::Cast<duckdb::BoundBaseTableRef>(pBVar22);
    pTVar5 = pBVar23->table;
    if ((pTVar5->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.temporary == true) {
      pCVar15 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
                operator->(this_00);
      pCVar15->temporary = true;
    }
    StatementProperties::RegisterDBModify
              (this_01,(pTVar5->super_StandardEntry).super_InCatalogEntry.catalog,this->context);
    unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>::operator*
              ((unique_ptr<duckdb::BoundTableRef,_std::default_delete<duckdb::BoundTableRef>,_true>
                *)&local_2e0._M_allocated_capacity);
    CreatePlan((Binder *)local_1a0,(BoundTableRef *)this);
    pLVar25 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)local_1a0);
    if (pLVar25->type != LOGICAL_GET) {
      pBVar34 = (BinderException *)__cxa_allocate_exception(0x10);
      local_178._0_8_ = (long)local_178 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"Cannot create index on a view!","");
      BinderException::BinderException(pBVar34,(string *)local_178);
      __cxa_throw(pBVar34,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pCVar19 = (pTVar5->super_StandardEntry).super_InCatalogEntry.catalog;
    local_1b0 = (DatabaseInstance *)local_1a0._0_8_;
    local_1a0._0_8_ = (DatabaseInstance *)0x0;
    (*pCVar19->_vptr_Catalog[0x11])(local_178,pCVar19,this,stmt,pTVar5);
    uVar17 = local_178._0_8_;
    _Var30._M_head_impl = local_318._M_head_impl;
    local_178._0_8_ = (_Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>)0x0;
    local_318._M_head_impl = (LogicalCreateTable *)uVar17;
    if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)_Var30._M_head_impl !=
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0) &&
       ((**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(_Var30._M_head_impl)->super_LogicalOperator)->_M_allocated_capacity + 8))
                  (),
       (_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
        )local_178._0_8_ != (BoundCreateTableInfo *)0x0)) {
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_178._0_8_)->__weak_this_).
                  internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
    }
    local_178._0_8_ =
         (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
         0x0;
    if (local_1b0 != (DatabaseInstance *)0x0) {
      (*(code *)(((local_1b0->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                  internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.
                internal.super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)();
    }
    local_1b0 = (DatabaseInstance *)0x0;
    if ((DatabaseInstance *)local_1a0._0_8_ != (DatabaseInstance *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::DatabaseInstance> *)local_1a0._0_8_)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_allocated_capacity !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*local_2e0._M_allocated_capacity + 8))();
    }
    if ((BaseTableRef *)local_368._0_8_ != (BaseTableRef *)0x0) {
      (**(code **)(*(long *)local_368._0_8_ + 8))();
    }
    ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
              (&local_240);
    if (local_268._0_8_ != local_258) {
      operator_delete((void *)local_268.bigint);
    }
    _Var30._M_head_impl = local_318._M_head_impl;
    if (local_288._0_8_ != local_278) {
      operator_delete((void *)local_288.bigint);
      _Var30._M_head_impl = local_318._M_head_impl;
    }
    break;
  default:
switchD_011bcc47_caseD_5:
    this_06 = (InternalException *)__cxa_allocate_exception(0x10);
    local_2a8 = (undefined1  [8])&local_298;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_2a8,"Unrecognized type!","");
    InternalException::InternalException(this_06,(string *)local_2a8);
    __cxa_throw(this_06,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 6:
    pCVar28 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator*(this_00);
    oVar29.ptr = BindCreateSchema(this,pCVar28);
    _Var30._M_head_impl = (LogicalCreateTable *)operator_new(0x78);
    local_2a8 = (undefined1  [8])
                (this_00->
                super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
                .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    LogicalCreate::LogicalCreate
              ((LogicalCreate *)_Var30._M_head_impl,LOGICAL_CREATE_SEQUENCE,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               local_2a8,oVar29);
LAB_011bd9b5:
    _Var37._M_head_impl = local_318._M_head_impl;
    if (local_2a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_2a8 + 8))();
      _Var37._M_head_impl = local_318._M_head_impl;
    }
LAB_011bd9d8:
    local_318._M_head_impl = _Var30._M_head_impl;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var37._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(*(size_type *)_Var37._M_head_impl + 8))();
    }
    goto LAB_011bd9e3;
  case 8:
    pCVar28 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator*(this_00);
    oVar29.ptr = BindCreateSchema(this,pCVar28);
    pCVar15 = unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true>::
              operator->(this_00);
    _Var30._M_head_impl = (LogicalCreateTable *)operator_new(0x78);
    local_2a8 = (undefined1  [8])
                (this_00->
                super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t
                .super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>
                ._M_t.
                super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>
                .super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl;
    (this_00->super_unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>)._M_t.
    super___uniq_ptr_impl<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::CreateInfo_*,_std::default_delete<duckdb::CreateInfo>_>.
    super__Head_base<0UL,_duckdb::CreateInfo_*,_false>._M_head_impl = (CreateInfo *)0x0;
    LogicalCreate::LogicalCreate
              ((LogicalCreate *)_Var30._M_head_impl,LOGICAL_CREATE_TYPE,
               (unique_ptr<duckdb::CreateInfo,_std::default_delete<duckdb::CreateInfo>,_true> *)
               local_2a8,oVar29);
    if (local_2a8 != (undefined1  [8])0x0) {
      (**(code **)(*(size_type *)local_2a8 + 8))();
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&(local_318._M_head_impl)->super_LogicalOperator;
      local_318._M_head_impl = _Var30._M_head_impl;
      (**(code **)(paVar27->_M_allocated_capacity + 8))();
      _Var30._M_head_impl = local_318._M_head_impl;
    }
    local_318._M_head_impl = _Var30._M_head_impl;
    pCVar19 = Catalog::GetCatalog(this->context,&pCVar15->catalog);
    if (pCVar15[1].schema._M_string_length == 0) {
      paVar27 = &pCVar15[1].catalog.field_2;
      if (pCVar15[1].catalog.field_2._M_local_buf[0] == '\x04') {
        local_38 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                   ::_M_invoke;
        local_40 = (__node_base_ptr)
                   ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                   ::_M_manager;
        local_50._M_unused._M_object = &pCVar15->dependencies;
        local_50._8_8_ = pCVar19;
        SetCatalogLookupCallback(this,(catalog_entry_callback_t *)&local_50);
        if (local_40 != (__node_base_ptr)0x0) {
          (*(code *)local_40)(&local_50,&local_50,3);
        }
        psVar31 = UserType::GetTypeName_abi_cxx11_((LogicalType *)paVar27);
        EntryLookupInfo::EntryLookupInfo
                  ((EntryLookupInfo *)local_2a8,TYPE_ENTRY,psVar31,
                   (QueryErrorContext)0xffffffffffffffff);
        psVar31 = Catalog::GetName_abi_cxx11_(((oVar29.ptr)->super_InCatalogEntry).catalog);
        local_178._0_8_ =
             CatalogEntryRetriever::GetEntry
                       (&this->entry_retriever,psVar31,
                        &((oVar29.ptr)->super_InCatalogEntry).super_CatalogEntry.name,
                        (EntryLookupInfo *)local_2a8,THROW_EXCEPTION);
        optional_ptr<duckdb::CatalogEntry,_true>::CheckValid
                  ((optional_ptr<duckdb::CatalogEntry,_true> *)local_178);
        if (paVar27 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_178._0_8_ + 0x120)) {
          pCVar15[1].catalog.field_2._M_local_buf[0] =
               *(char *)&(((atomic<unsigned_long> *)(local_178._0_8_ + 0x120))->
                         super___atomic_base<unsigned_long>)._M_i;
          pCVar15[1].catalog.field_2._M_local_buf[1] =
               *(undefined1 *)
                ((long)&(((atomic<unsigned_long> *)(local_178._0_8_ + 0x120))->
                        super___atomic_base<unsigned_long>)._M_i + 1);
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                     ((long)&pCVar15[1].catalog.field_2 + 8),
                     (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_178._0_8_ + 0x128));
        }
      }
      else {
        local_58 = ::std::
                   _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
                   ::_M_invoke;
        local_60._M_nxt =
             (_Hash_node_base *)
             ::std::
             _Function_handler<void_(duckdb::CatalogEntry_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/statement/bind_create.cpp:491:30)>
             ::_M_manager;
        local_70._M_unused._M_object = &pCVar15->dependencies;
        local_70._8_8_ = pCVar19;
        SetCatalogLookupCallback(this,(catalog_entry_callback_t *)&local_70);
        if (local_60._M_nxt != (_Hash_node_base *)0x0) {
          (*(code *)local_60._M_nxt)(&local_70,&local_70,3);
        }
        LogicalType::LogicalType((LogicalType *)local_178,(LogicalType *)paVar27);
        local_2a8 = (undefined1  [8])&local_298;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2a8,anon_var_dwarf_6372561 + 9);
        BindLogicalType(this,(LogicalType *)paVar27,(optional_ptr<duckdb::Catalog,_true>)0x0,
                        (string *)local_2a8);
        if (local_2a8 != (undefined1  [8])&local_298) {
          operator_delete((void *)local_2a8);
        }
        if ((LogicalType *)paVar27 != (LogicalType *)local_178) {
          pCVar15[1].catalog.field_2._M_local_buf[0] = (char)local_178[0];
          pCVar15[1].catalog.field_2._M_local_buf[1] = local_178[1];
          shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                    ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                     ((long)&pCVar15[1].catalog.field_2 + 8),
                     (shared_ptr<duckdb::ExtraTypeInfo,_true> *)(local_178 + 8));
        }
        LogicalType::~LogicalType((LogicalType *)local_178);
      }
      goto LAB_011bd9e3;
    }
    this_07 = &pCVar15[1].schema._M_string_length;
    statement = unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>::
                operator*((unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                           *)this_07);
    Bind((BoundStatement *)local_2a8,this,statement);
    local_1a0._0_8_ = local_2a8;
    local_2a8 = (undefined1  [8])0x0;
    plVar6 = (long *)*this_07;
    *this_07 = 0;
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 8))();
    }
    if (local_298._M_allocated_capacity - (long)peStack_2a0 != 0x18) {
      pBVar34 = (BinderException *)__cxa_allocate_exception(0x10);
      local_178._0_8_ = (long)local_178 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_178,"The query must return a single column","");
      BinderException::BinderException(pBVar34,(string *)local_178);
      __cxa_throw(pBVar34,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar24 = vector<duckdb::LogicalType,_true>::operator[]
                        ((vector<duckdb::LogicalType,_true> *)&peStack_2a0,0);
    if (pvVar24->id_ != VARCHAR) {
      local_368._0_8_ =
           (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0;
      local_368._8_8_ = (element_type *)0x0;
      local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pvVar24 = vector<duckdb::LogicalType,_true>::operator[]
                          ((vector<duckdb::LogicalType,_true> *)&peStack_2a0,0);
      pLVar25 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                              *)local_1a0);
      (*pLVar25->_vptr_LogicalOperator[2])(&local_2e0);
      pvVar26 = vector<duckdb::ColumnBinding,_true>::operator[]
                          ((vector<duckdb::ColumnBinding,_true> *)&local_2e0,0);
      this_03 = (BoundColumnRefExpression *)operator_new(0x70);
      LogicalType::LogicalType((LogicalType *)local_178,pvVar24);
      binding.table_index = pvVar26->table_index;
      binding.column_index = pvVar26->column_index;
      BoundColumnRefExpression::BoundColumnRefExpression(this_03,(LogicalType *)local_178,binding,0)
      ;
      LogicalType::~LogicalType((LogicalType *)local_178);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete((void *)local_2e0._M_allocated_capacity);
      }
      pCVar4 = this->context;
      local_320.index = (idx_t)this_03;
      LogicalType::LogicalType((LogicalType *)local_178,VARCHAR);
      BoundCastExpression::AddCastToType
                ((BoundCastExpression *)&local_2e0,pCVar4,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_320,(LogicalType *)local_178,false);
      LogicalType::~LogicalType((LogicalType *)local_178);
      if ((BoundColumnRefExpression *)local_320.index != (BoundColumnRefExpression *)0x0) {
        (**(code **)(*(long *)local_320.index + 8))();
      }
      local_320.index = 0;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                  *)local_368,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_2e0._M_allocated_capacity);
      table_index = GenerateTableIndex(this);
      paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)operator_new(0x70);
      local_178._0_8_ = local_368._0_8_;
      local_178._8_8_ = local_368._8_8_;
      local_178._16_8_ = local_368._16_8_;
      local_368._0_8_ =
           (tuple<duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>)0x0;
      local_368._8_8_ = (element_type *)0x0;
      local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      LogicalProjection::LogicalProjection
                ((LogicalProjection *)paVar27,table_index,
                 (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                  *)local_178);
      local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)paVar27;
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_178);
      this_04 = unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                ::operator->((unique_ptr<duckdb::LogicalProjection,_std::default_delete<duckdb::LogicalProjection>,_true>
                              *)&local_e8);
      local_1c0._M_head_impl = (LogicalOperator *)local_1a0._0_8_;
      local_1a0._0_8_ = (DatabaseInstance *)0x0;
      LogicalOperator::AddChild
                (&this_04->super_LogicalOperator,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)&local_1c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_head_impl !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)&(local_1c0._M_head_impl)->_vptr_LogicalOperator)->_M_allocated_capacity +
                    8))();
      }
      _Var12._M_pi = local_e8._M_pi;
      uVar17 = local_1a0._0_8_;
      local_1c0._M_head_impl = (LogicalOperator *)0x0;
      local_e8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a0._0_8_ = _Var12._M_pi;
      if (((DatabaseInstance *)uVar17 != (DatabaseInstance *)0x0) &&
         ((*(code *)(((((enable_shared_from_this<duckdb::DatabaseInstance> *)uVar17)->__weak_this_).
                      internal.
                      super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                    ->super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal
                    .super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)(),
         local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        (*(local_e8._M_pi)->_vptr__Sp_counted_base[1])();
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2e0._M_allocated_capacity !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        (**(code **)(*local_2e0._M_allocated_capacity + 8))();
      }
      ::std::
      vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
      ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                 *)local_368);
    }
    pLVar25 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                            *)&local_318);
    local_1c8._M_head_impl = (LogicalOperator *)local_1a0._0_8_;
    local_1a0._0_8_ = (DatabaseInstance *)0x0;
    LogicalOperator::AddChild
              (pLVar25,(unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                        *)&local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_head_impl !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)&(local_1c8._M_head_impl)->_vptr_LogicalOperator)->_M_allocated_capacity + 8)
      )();
    }
    local_1c8._M_head_impl = (LogicalOperator *)0x0;
    if ((DatabaseInstance *)local_1a0._0_8_ != (DatabaseInstance *)0x0) {
      (*(code *)(((((enable_shared_from_this<duckdb::DatabaseInstance> *)local_1a0._0_8_)->
                  __weak_this_).internal.
                  super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::DatabaseInstance>).__weak_this_.internal.
                super___weak_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi)();
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_288.hugeint);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
              ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&peStack_2a0);
    _Var37._M_head_impl = (LogicalCreateTable *)local_2a8;
    _Var30._M_head_impl = local_318._M_head_impl;
    goto LAB_011bd9d8;
  }
  local_318._M_head_impl = _Var30._M_head_impl;
  if (local_2a8 != (undefined1  [8])&local_298) {
    operator_delete((void *)local_2a8);
  }
LAB_011bd9e3:
  this_01->return_type = NOTHING;
  this_01->allow_stream_result = false;
  (local_1a8->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_318._M_head_impl;
  local_318._M_head_impl = (LogicalCreateTable *)0x0;
  (local_1a8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)_Stack_310._M_head_impl;
  (local_1a8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_308;
  (local_1a8->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pCStack_300;
  pCStack_300 = (ClientContext *)0x0;
  _Stack_310._M_head_impl = (BoundCreateTableInfo *)0x0;
  local_308 = (element_type *)0x0;
  (local_1a8->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_2f8._M_t.
                super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
                .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl;
  (local_1a8->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)peStack_2f0;
  (local_1a8->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_2e8;
  local_2e8 = (ClientContext *)0x0;
  local_2f8._M_t.
  super__Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
  .super__Head_base<0UL,_duckdb::BoundCreateTableInfo_*,_false>._M_head_impl =
       (tuple<duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>)
       (_Tuple_impl<0UL,_duckdb::BoundCreateTableInfo_*,_std::default_delete<duckdb::BoundCreateTableInfo>_>
        )0x0;
  peStack_2f0 = (element_type *)0x0;
  pBVar35 = local_1a8;
LAB_011bda5f:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_2f8);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&_Stack_310);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_head_impl !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)&(local_318._M_head_impl)->super_LogicalOperator)->_M_allocated_capacity + 8))
              ();
  }
  return pBVar35;
}

Assistant:

BoundStatement Binder::Bind(CreateStatement &stmt) {
	BoundStatement result;
	result.names = {"Count"};
	result.types = {LogicalType::BIGINT};

	auto catalog_type = stmt.info->type;
	auto &properties = GetStatementProperties();
	switch (catalog_type) {
	case CatalogType::SCHEMA_ENTRY: {
		auto &base = stmt.info->Cast<CreateInfo>();
		auto catalog = BindCatalog(base.catalog);
		properties.RegisterDBModify(Catalog::GetCatalog(context, catalog), context);
		result.plan = make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_SCHEMA, std::move(stmt.info));
		break;
	}
	case CatalogType::VIEW_ENTRY: {
		auto &base = stmt.info->Cast<CreateViewInfo>();
		// bind the schema
		auto &schema = BindCreateSchema(*stmt.info);
		BindCreateViewInfo(base);
		result.plan = make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_VIEW, std::move(stmt.info), &schema);
		break;
	}
	case CatalogType::SEQUENCE_ENTRY: {
		auto &schema = BindCreateSchema(*stmt.info);
		result.plan =
		    make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_SEQUENCE, std::move(stmt.info), &schema);
		break;
	}
	case CatalogType::TABLE_MACRO_ENTRY: {
		auto &schema = BindCreateSchema(*stmt.info);
		result.plan =
		    make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_MACRO, std::move(stmt.info), &schema);
		break;
	}
	case CatalogType::MACRO_ENTRY: {
		auto &schema = BindCreateFunctionInfo(*stmt.info);
		auto logical_create =
		    make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_MACRO, std::move(stmt.info), &schema);
		result.plan = std::move(logical_create);
		break;
	}
	case CatalogType::INDEX_ENTRY: {
		auto &create_index_info = stmt.info->Cast<CreateIndexInfo>();

		// Plan the table scan.
		TableDescription table_description(create_index_info.catalog, create_index_info.schema,
		                                   create_index_info.table);
		auto table_ref = make_uniq<BaseTableRef>(table_description);
		auto bound_table = Bind(*table_ref);
		if (bound_table->type != TableReferenceType::BASE_TABLE) {
			throw BinderException("can only create an index on a base table");
		}

		auto &table_binding = bound_table->Cast<BoundBaseTableRef>();
		auto &table = table_binding.table;
		if (table.temporary) {
			stmt.info->temporary = true;
		}
		properties.RegisterDBModify(table.catalog, context);

		// create a plan over the bound table
		auto plan = CreatePlan(*bound_table);
		if (plan->type != LogicalOperatorType::LOGICAL_GET) {
			throw BinderException("Cannot create index on a view!");
		}

		result.plan = table.catalog.BindCreateIndex(*this, stmt, table, std::move(plan));
		break;
	}
	case CatalogType::TABLE_ENTRY: {
		auto bound_info = BindCreateTableInfo(std::move(stmt.info));
		auto root = std::move(bound_info->query);

		// create the logical operator
		auto &schema = bound_info->schema;
		auto create_table = make_uniq<LogicalCreateTable>(schema, std::move(bound_info));
		if (root) {
			// CREATE TABLE AS
			properties.return_type = StatementReturnType::CHANGED_ROWS;
			create_table->children.push_back(std::move(root));
		}
		result.plan = std::move(create_table);
		break;
	}
	case CatalogType::TYPE_ENTRY: {
		auto &schema = BindCreateSchema(*stmt.info);
		auto &create_type_info = stmt.info->Cast<CreateTypeInfo>();
		result.plan = make_uniq<LogicalCreate>(LogicalOperatorType::LOGICAL_CREATE_TYPE, std::move(stmt.info), &schema);

		auto &catalog = Catalog::GetCatalog(context, create_type_info.catalog);
		auto &dependencies = create_type_info.dependencies;
		auto dependency_callback = [&dependencies, &catalog](CatalogEntry &entry) {
			if (&catalog != &entry.ParentCatalog()) {
				// Don't register any cross-catalog dependencies
				return;
			}
			dependencies.AddDependency(entry);
		};
		if (create_type_info.query) {
			// CREATE TYPE mood AS ENUM (SELECT 'happy')
			auto query_obj = Bind(*create_type_info.query);
			auto query = std::move(query_obj.plan);
			create_type_info.query.reset();

			auto &sql_types = query_obj.types;
			if (sql_types.size() != 1) {
				// add cast expression?
				throw BinderException("The query must return a single column");
			}
			if (sql_types[0].id() != LogicalType::VARCHAR) {
				// push a projection casting to varchar
				vector<unique_ptr<Expression>> select_list;
				auto ref = make_uniq<BoundColumnRefExpression>(sql_types[0], query->GetColumnBindings()[0]);
				auto cast_expr = BoundCastExpression::AddCastToType(context, std::move(ref), LogicalType::VARCHAR);
				select_list.push_back(std::move(cast_expr));
				auto proj = make_uniq<LogicalProjection>(GenerateTableIndex(), std::move(select_list));
				proj->AddChild(std::move(query));
				query = std::move(proj);
			}

			result.plan->AddChild(std::move(query));
		} else if (create_type_info.type.id() == LogicalTypeId::USER) {
			SetCatalogLookupCallback(dependency_callback);
			// two cases:
			// 1: create a type with a non-existent type as source, Binder::BindLogicalType(...) will throw exception.
			// 2: create a type alias with a custom type.
			// eg. CREATE TYPE a AS INT; CREATE TYPE b AS a;
			// We set b to be an alias for the underlying type of a

			EntryLookupInfo type_lookup(CatalogType::TYPE_ENTRY, UserType::GetTypeName(create_type_info.type));
			auto type_entry_p = entry_retriever.GetEntry(schema.catalog.GetName(), schema.name, type_lookup);
			D_ASSERT(type_entry_p);
			auto &type_entry = type_entry_p->Cast<TypeCatalogEntry>();
			create_type_info.type = type_entry.user_type;
		} else {
			SetCatalogLookupCallback(dependency_callback);
			// This is done so that if the type contains a USER type,
			// we register this dependency
			auto preserved_type = create_type_info.type;
			BindLogicalType(create_type_info.type);
			create_type_info.type = preserved_type;
		}
		break;
	}
	case CatalogType::SECRET_ENTRY: {
		CatalogTransaction transaction = CatalogTransaction(Catalog::GetSystemCatalog(context), context);
		properties.return_type = StatementReturnType::QUERY_RESULT;

		auto &info = stmt.info->Cast<CreateSecretInfo>();

		// We need to execute all expressions in the CreateSecretInfo to construct a CreateSecretInput
		ConstantBinder default_binder(*this, context, "Secret Parameter");

		string provider_string, type_string;
		vector<string> scope_strings;

		if (info.provider) {
			auto bound_provider = default_binder.Bind(info.provider);
			if (bound_provider->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			provider_string =
			    StringUtil::Lower(ExpressionExecutor::EvaluateScalar(context, *bound_provider, true).ToString());
		}
		if (info.type) {
			auto bound_type = default_binder.Bind(info.type);
			if (bound_type->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			type_string = StringUtil::Lower(ExpressionExecutor::EvaluateScalar(context, *bound_type, true).ToString());
		}
		if (info.scope) {
			auto bound_scope = default_binder.Bind(info.scope);
			if (bound_scope->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			// Execute all scope expressions
			Value scope = ExpressionExecutor::EvaluateScalar(context, *bound_scope, true);
			if (scope.type() == LogicalType::VARCHAR) {
				scope_strings.push_back(scope.ToString());
			} else if (scope.type() == LogicalType::LIST(LogicalType::VARCHAR)) {
				for (const auto &item : ListValue::GetChildren(scope)) {
					scope_strings.push_back(item.GetValue<string>());
				}
			} else if (scope.type().InternalType() == PhysicalType::STRUCT) {
				// struct expression with empty keys is also allowed for backwards compatibility to when the create
				// secret statement would be parsed differently: this allows CREATE SECRET (TYPE x, SCOPE ('bla',
				// 'bloe'))
				for (const auto &child : StructValue::GetChildren(scope)) {
					if (child.type() != LogicalType::VARCHAR) {
						throw InvalidInputException(
						    "Invalid input to scope parameter of create secret: only struct of VARCHARs is allowed");
					}
					scope_strings.push_back(child.GetValue<string>());
				}
			} else {
				throw InvalidInputException("Create Secret scope must be of type VARCHAR or LIST(VARCHAR)");
			}
		}

		// Execute all options expressions
		case_insensitive_map_t<Value> bound_options;
		for (auto &option : info.options) {
			auto bound_value = default_binder.Bind(option.second);
			if (bound_value->HasParameter()) {
				throw InvalidInputException("Create Secret expressions can not have parameters!");
			}
			bound_options.insert({option.first, ExpressionExecutor::EvaluateScalar(context, *bound_value, true)});
		}

		CreateSecretInput create_secret_input {type_string,   provider_string, info.storage_type, info.name,
		                                       scope_strings, bound_options,   info.on_conflict,  info.persist_type};

		return SecretManager::Get(context).BindCreateSecret(transaction, create_secret_input);
	}
	default:
		throw InternalException("Unrecognized type!");
	}
	properties.return_type = StatementReturnType::NOTHING;
	properties.allow_stream_result = false;
	return result;
}